

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<long_double>::default_cost_type
          (default_cost_type<long_double> *this,objective_function *obj_,int n)

{
  pointer poVar1;
  longdouble *__s;
  pointer poVar2;
  long lVar3;
  ulong __n;
  
  this->obj = obj_;
  __n = 0xffffffffffffffff;
  if (-1 < n) {
    __n = (ulong)(uint)n << 4;
  }
  __s = (longdouble *)operator_new__(__n);
  memset(__s,0,__n);
  (this->linear_elements)._M_t.
  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = __s;
  poVar2 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (poVar2 == poVar1) {
      return;
    }
    lVar3 = (long)poVar2->variable_index;
    if ((lVar3 < 0) || (n <= poVar2->variable_index)) break;
    __s[lVar3] = __s[lVar3] + (longdouble)poVar2->factor;
    poVar2 = poVar2 + 1;
  }
  itm::default_cost_type();
}

Assistant:

default_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        for (const auto& elem : obj.elements) {
            bx_ensures(0 <= elem.variable_index && elem.variable_index < n);

            linear_elements[elem.variable_index] +=
              static_cast<Float>(elem.factor);
        }
    }